

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUnionFind.cpp
# Opt level: O3

void __thiscall btUnionFind::~btUnionFind(btUnionFind *this)

{
  btElement *ptr;
  
  ptr = (this->m_elements).m_data;
  if ((ptr != (btElement *)0x0) && ((this->m_elements).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr);
  }
  (this->m_elements).m_ownsMemory = true;
  (this->m_elements).m_data = (btElement *)0x0;
  (this->m_elements).m_size = 0;
  (this->m_elements).m_capacity = 0;
  btAlignedObjectArray<btElement>::~btAlignedObjectArray(&this->m_elements);
  return;
}

Assistant:

btUnionFind::~btUnionFind()
{
	Free();

}